

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi__context *psVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi_uc sVar5;
  stbi_uc *psVar6;
  
  sVar3 = j->marker;
  if (sVar3 == 0xff) {
    psVar1 = j->s;
    psVar2 = psVar1->img_buffer;
    if (psVar2 < psVar1->img_buffer_end) {
      psVar1->img_buffer = psVar2 + 1;
      sVar5 = *psVar2;
    }
    else {
      if (psVar1->read_from_callbacks == 0) {
        return 0xff;
      }
      psVar2 = psVar1->buffer_start;
      iVar4 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar2,psVar1->buflen);
      if (iVar4 == 0) {
        psVar1->read_from_callbacks = 0;
        psVar6 = psVar1->buffer_start + 1;
        psVar1->buffer_start[0] = '\0';
        sVar5 = '\0';
      }
      else {
        psVar6 = psVar2 + iVar4;
        sVar5 = *psVar2;
      }
      psVar1->img_buffer_end = psVar6;
      psVar1->img_buffer = psVar1->buffer_start + 1;
    }
    sVar3 = 0xff;
    while (sVar5 == 0xff) {
      psVar1 = j->s;
      psVar2 = psVar1->img_buffer;
      if (psVar2 < psVar1->img_buffer_end) {
        psVar1->img_buffer = psVar2 + 1;
        sVar3 = *psVar2;
        sVar5 = sVar3;
      }
      else {
        if (psVar1->read_from_callbacks == 0) {
          return '\0';
        }
        psVar2 = psVar1->buffer_start;
        iVar4 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar2,psVar1->buflen);
        if (iVar4 == 0) {
          psVar1->read_from_callbacks = 0;
          psVar6 = psVar1->buffer_start + 1;
          psVar1->buffer_start[0] = '\0';
          sVar3 = '\0';
        }
        else {
          psVar6 = psVar2 + iVar4;
          sVar3 = *psVar2;
        }
        psVar1->img_buffer_end = psVar6;
        psVar1->img_buffer = psVar1->buffer_start + 1;
        sVar5 = sVar3;
      }
    }
  }
  else {
    j->marker = 0xff;
  }
  return sVar3;
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg* j)
{
    stbi_uc x;
    if (j->marker != STBI__MARKER_none) {
        x = j->marker;
        j->marker = STBI__MARKER_none;
        return x;
    }
    x = stbi__get8(j->s);
    if (x != 0xff)
        return STBI__MARKER_none;
    while (x == 0xff)
        x = stbi__get8(j->s); // consume repeated 0xff fill bytes
    return x;
}